

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawSpanTranslucentP_C(void)

{
  byte bVar1;
  byte bVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  lighttable_t *plVar5;
  dsfixed_t dVar6;
  dsfixed_t dVar7;
  BYTE *pBVar8;
  byte bVar9;
  uint uVar10;
  DWORD bg_1;
  DWORD fg_1;
  int xmask;
  BYTE xshift;
  BYTE yshift;
  DWORD bg;
  DWORD fg;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int spot;
  int count;
  BYTE *colormap;
  BYTE *source;
  BYTE *dest;
  dsfixed_t ystep;
  dsfixed_t xstep;
  dsfixed_t yfrac;
  dsfixed_t xfrac;
  
  pBVar8 = ds_source;
  dVar7 = ds_ystep;
  dVar6 = ds_xstep;
  plVar5 = ds_colormap;
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  xstep = ds_xfrac;
  ystep = ds_yfrac;
  source = dc_destorg + (ylookup[ds_y] + ds_x1);
  fg2rgb._4_4_ = (ds_x2 - ds_x1) + 1;
  if ((ds_xbits == 6) && (ds_ybits == 6)) {
    do {
      uVar10 = pDVar3[plVar5[pBVar8[(int)((xstep >> 0x14 & 0xfc0) + (ystep >> 0x1a))]]] +
               pDVar4[*source] | 0x1f07c1f;
      *source = RGB32k.All[uVar10 & uVar10 >> 0xf];
      xstep = dVar6 + xstep;
      ystep = dVar7 + ystep;
      fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
      source = source + 1;
    } while (fg2rgb._4_4_ != 0);
  }
  else {
    bVar1 = (byte)ds_ybits;
    bVar9 = 0x20 - bVar1;
    bVar2 = (byte)ds_xbits;
    do {
      uVar10 = pDVar3[plVar5[pBVar8[(int)((xstep >> (bVar9 - bVar2 & 0x1f) &
                                          (1 << (bVar2 & 0x1f)) + -1 << (bVar1 & 0x1f)) +
                                         (ystep >> (bVar9 & 0x1f)))]]] + pDVar4[*source] | 0x1f07c1f
      ;
      *source = RGB32k.All[uVar10 & uVar10 >> 0xf];
      xstep = dVar6 + xstep;
      ystep = dVar7 + ystep;
      fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
      source = source + 1;
    } while (fg2rgb._4_4_ != 0);
  }
  return;
}

Assistant:

void R_DrawSpanTranslucentP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;
	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));
			DWORD fg = colormap[source[spot]];
			DWORD bg = *dest;
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[fg & (fg>>15)];
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;
		do
		{
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
			DWORD fg = colormap[source[spot]];
			DWORD bg = *dest;
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[fg & (fg>>15)];
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}